

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O2

void modifyChannels<unsigned_int>
               (list<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_>
                *channels,uint delta)

{
  int *piVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  _List_node_base *p_Var8;
  bool bVar9;
  
  p_Var3 = (_List_node_base *)channels;
  while (p_Var3 = (((_List_base<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_>
                     *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)channels) {
    lVar4 = (long)p_Var3[1]._M_next;
    if ((long)p_Var3[1]._M_next < 1) {
      lVar4 = 0;
    }
    lVar5 = 0;
    for (lVar6 = 0; lVar6 != lVar4; lVar6 = lVar6 + 1) {
      p_Var2 = p_Var3[1]._M_prev;
      p_Var8 = (_List_node_base *)0x0;
      if (0 < (long)p_Var2) {
        p_Var8 = p_Var2;
      }
      lVar7 = (long)p_Var2 * lVar5;
      while (bVar9 = p_Var8 != (_List_node_base *)0x0,
            p_Var8 = (_List_node_base *)((long)&p_Var8[-1]._M_prev + 7), bVar9) {
        piVar1 = (int *)((long)p_Var3[2]._M_next + lVar7);
        *piVar1 = *piVar1 + delta;
        lVar7 = lVar7 + 4;
      }
      lVar5 = lVar5 + 4;
    }
  }
  return;
}

Assistant:

void
modifyChannels (list<Array2D<T>>& channels, T delta)
{
    //
    // Dummy code modifying each pixel by incrementing every channel by a given delta.
    //

    for (auto i = channels.begin (); i != channels.end (); i++)
    {
        Array2D<T>& channel = *i;

        for (int y = 0; y < channel.height (); y++)
        {
            for (int x = 0; x < channel.width (); x++)
            {
                channel[y][x] += delta;
            }
        }
    }
}